

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.c
# Opt level: O3

token * dmrC_assignment_expression(dmr_C *C,token *token,expression **tree)

{
  uint uVar1;
  position pVar2;
  token *ptVar3;
  long lVar4;
  expression *peVar5;
  
  ptVar3 = dmrC_conditional_expression(C,token,tree);
  if (*tree != (expression *)0x0) {
    while (pVar2 = ptVar3->pos, (pVar2._0_4_ & 0x3f) == 0x11) {
      uVar1 = (ptVar3->field_2).special;
      lVar4 = 0;
      while (*(uint *)((long)dmrC_assignment_expression::assignments + lVar4) != uVar1) {
        lVar4 = lVar4 + 4;
        if (lVar4 == 0x2c) {
          return ptVar3;
        }
      }
      peVar5 = (expression *)dmrC_allocator_allocate(&C->expression_allocator,0);
      *(undefined1 *)peVar5 = 6;
      peVar5->pos = pVar2;
      (peVar5->field_5).field_4.symbol = (symbol *)*tree;
      peVar5->op = uVar1;
      *tree = peVar5;
      tree = &(peVar5->field_5).field_6.right;
      ptVar3 = dmrC_conditional_expression(C,ptVar3->next,tree);
      if ((peVar5->field_5).field_2.string == (string *)0x0) {
        return ptVar3;
      }
    }
  }
  return ptVar3;
}

Assistant:

struct token *dmrC_assignment_expression(struct dmr_C *C, struct token *token, struct expression **tree)
{
	token = dmrC_conditional_expression(C, token, tree);
	if (*tree && dmrC_token_type(token) == TOKEN_SPECIAL) {
		static const int assignments[] = {
			'=',
			SPECIAL_ADD_ASSIGN, SPECIAL_SUB_ASSIGN,
			SPECIAL_MUL_ASSIGN, SPECIAL_DIV_ASSIGN,
			SPECIAL_MOD_ASSIGN, SPECIAL_SHL_ASSIGN,
			SPECIAL_SHR_ASSIGN, SPECIAL_AND_ASSIGN,
			SPECIAL_OR_ASSIGN,  SPECIAL_XOR_ASSIGN };
		int i, op = token->special;
		for (i = 0; i < (int)ARRAY_SIZE(assignments); i++)
			if (assignments[i] == op) {
				struct expression * expr = dmrC_alloc_expression(C, token->pos, EXPR_ASSIGNMENT);
				expr->left = *tree;
				expr->op = op;
				*tree = expr;
				return dmrC_assignment_expression(C, token->next, &expr->right);
			}
	}
	return token;
}